

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void drop_item_tail(tgestate_t *state,item_t item)

{
  room_t rVar1;
  uint8_t uVar2;
  ushort uVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined7 in_register_00000031;
  
  uVar4 = CONCAT71(in_register_00000031,item) & 0xffffffff;
  rVar1 = state->room_index;
  state->item_structs[uVar4].room_and_flags = rVar1;
  if (rVar1 == '\0') {
    lVar8 = 0;
    do {
      (&state->item_structs[uVar4].mappos.u)[lVar8] =
           (uint8_t)((&state->vischars[0].mi.mappos.u)[lVar8] + 4 >> 3);
      lVar8 = lVar8 + 1;
    } while ((char)lVar8 != '\x03');
    state->item_structs[uVar4].mappos.w = '\0';
    uVar5 = state->item_structs[uVar4].mappos.u;
    uVar2 = state->item_structs[uVar4].mappos.v;
    state->item_structs[uVar4].isopos.x = (uVar2 - uVar5) * '\x02' + 0x80;
    uVar5 = -(uVar5 + uVar2);
  }
  else {
    uVar3 = state->vischars[0].mi.mappos.u;
    state->item_structs[uVar4].mappos.u = (uint8_t)uVar3;
    uVar7 = uVar3 & 0xff;
    uVar3 = state->vischars[0].mi.mappos.v;
    uVar6 = uVar3 & 0xff;
    state->item_structs[uVar4].mappos.v = (uint8_t)uVar3;
    state->item_structs[uVar4].mappos.w = '\x05';
    state->item_structs[uVar4].isopos.x = (uint8_t)((uVar6 - uVar7) * 2 + 0x404 >> 3);
    uVar5 = (uint8_t)(~(uVar6 + uVar7) >> 3);
  }
  state->item_structs[uVar4].isopos.y = uVar5;
  return;
}

Assistant:

void drop_item_tail(tgestate_t *state, item_t item)
{
  itemstruct_t *itemstr; /* was HL */
  room_t        room;    /* was A */
  mappos8_t    *outpos;  /* was DE */
  mappos16_t   *inpos;   /* was HL */

  assert(state != NULL);
  ASSERT_ITEM_VALID(item);

  itemstr = &state->item_structs[item];
  room = state->room_index;
  itemstr->room_and_flags = room; /* Set object's room index. */
  if (room == room_0_OUTDOORS)
  {
    /* Outdoors. */

    // TODO: Hoist common code.
    outpos = &itemstr->mappos;
    inpos  = &state->vischars[0].mi.mappos;

    scale_mappos_down(inpos, outpos);
    outpos->w = 0;

    calc_exterior_item_isopos(itemstr);
  }
  else
  {
    /* $7BE4: Drop item, interior part. */

    outpos = &itemstr->mappos;
    inpos  = &state->vischars[0].mi.mappos;

    outpos->u = inpos->u; // note: narrowing
    outpos->v = inpos->v; // note: narrowing
    outpos->w = 5;

    calc_interior_item_isopos(itemstr);
  }
}